

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O0

void __thiscall
btMultiBodyDynamicsWorld::updateActivationState(btMultiBodyDynamicsWorld *this,btScalar timeStep)

{
  btMultiBody *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  btMultiBody **ppbVar4;
  btCollisionObject *pbVar5;
  btMultibodyLink *pbVar6;
  long in_RDI;
  btMultiBodyLinkCollider *col_3;
  int b_1;
  btMultiBodyLinkCollider *col_2;
  btMultiBodyLinkCollider *col_1;
  int b;
  btMultiBodyLinkCollider *col;
  btMultiBody *body;
  int i;
  CProfileSample __profile;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  btMultibodyLink *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int local_54;
  btCollisionObject *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_14;
  
  CProfileSample::CProfileSample
            ((CProfileSample *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  for (local_14 = 0;
      iVar2 = btAlignedObjectArray<btMultiBody_*>::size
                        ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 0x1c8)), local_14 < iVar2;
      local_14 = local_14 + 1) {
    ppbVar4 = btAlignedObjectArray<btMultiBody_*>::operator[]
                        ((btAlignedObjectArray<btMultiBody_*> *)(in_RDI + 0x1c8),local_14);
    this_00 = *ppbVar4;
    if (this_00 != (btMultiBody *)0x0) {
      btMultiBody::checkMotionAndSleepIfRequired
                ((btMultiBody *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (btScalar)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      bVar1 = btMultiBody::isAwake(this_00);
      if (bVar1) {
        pbVar5 = (btCollisionObject *)btMultiBody::getBaseCollider(this_00);
        if ((pbVar5 != (btCollisionObject *)0x0) &&
           (iVar2 = btCollisionObject::getActivationState(pbVar5), iVar2 != 4)) {
          btCollisionObject::setActivationState(pbVar5,1);
        }
        local_54 = 0;
        while (in_stack_ffffffffffffff44 = local_54,
              iVar2 = btMultiBody::getNumLinks((btMultiBody *)0x24d708),
              in_stack_ffffffffffffff44 < iVar2) {
          in_stack_ffffffffffffff38 =
               btMultiBody::getLink
                         ((btMultiBody *)
                          CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                          in_stack_ffffffffffffff2c);
          pbVar5 = (btCollisionObject *)in_stack_ffffffffffffff38->m_collider;
          if ((pbVar5 != (btCollisionObject *)0x0) &&
             (in_stack_ffffffffffffff34 = btCollisionObject::getActivationState(pbVar5),
             in_stack_ffffffffffffff34 != 4)) {
            btCollisionObject::setActivationState(pbVar5,1);
          }
          local_54 = local_54 + 1;
        }
      }
      else {
        pbVar5 = (btCollisionObject *)btMultiBody::getBaseCollider(this_00);
        if ((pbVar5 != (btCollisionObject *)0x0) &&
           (iVar2 = btCollisionObject::getActivationState(pbVar5), iVar2 == 1)) {
          btCollisionObject::setActivationState(pbVar5,3);
          btCollisionObject::setDeactivationTime(pbVar5,0.0);
        }
        iVar2 = 0;
        while (in_stack_ffffffffffffffc4 = iVar2,
              iVar3 = btMultiBody::getNumLinks((btMultiBody *)0x24d5d6), iVar2 < iVar3) {
          pbVar6 = btMultiBody::getLink
                             ((btMultiBody *)
                              CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              in_stack_ffffffffffffff2c);
          in_stack_ffffffffffffffb8 = (btCollisionObject *)pbVar6->m_collider;
          if ((in_stack_ffffffffffffffb8 != (btCollisionObject *)0x0) &&
             (iVar2 = btCollisionObject::getActivationState(in_stack_ffffffffffffffb8), iVar2 == 1))
          {
            btCollisionObject::setActivationState(in_stack_ffffffffffffffb8,3);
            btCollisionObject::setDeactivationTime(in_stack_ffffffffffffffb8,0.0);
          }
          iVar2 = in_stack_ffffffffffffffc4 + 1;
        }
      }
    }
  }
  btDiscreteDynamicsWorld::updateActivationState
            ((btDiscreteDynamicsWorld *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (btScalar)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  CProfileSample::~CProfileSample((CProfileSample *)0x24d7d0);
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::updateActivationState(btScalar timeStep)
{
	BT_PROFILE("btMultiBodyDynamicsWorld::updateActivationState");

	
	
	for ( int i=0;i<m_multiBodies.size();i++)
	{
		btMultiBody* body = m_multiBodies[i];
		if (body)
		{
			body->checkMotionAndSleepIfRequired(timeStep);
			if (!body->isAwake())
			{
				btMultiBodyLinkCollider* col = body->getBaseCollider();
				if (col && col->getActivationState() == ACTIVE_TAG)
				{
					col->setActivationState( WANTS_DEACTIVATION);
					col->setDeactivationTime(0.f);
				}
				for (int b=0;b<body->getNumLinks();b++)
				{
					btMultiBodyLinkCollider* col = body->getLink(b).m_collider;
					if (col && col->getActivationState() == ACTIVE_TAG)
					{
						col->setActivationState( WANTS_DEACTIVATION);
						col->setDeactivationTime(0.f);
					}
				}
			} else
			{
				btMultiBodyLinkCollider* col = body->getBaseCollider();
				if (col && col->getActivationState() != DISABLE_DEACTIVATION)
					col->setActivationState( ACTIVE_TAG );

				for (int b=0;b<body->getNumLinks();b++)
				{
					btMultiBodyLinkCollider* col = body->getLink(b).m_collider;
					if (col && col->getActivationState() != DISABLE_DEACTIVATION)
						col->setActivationState( ACTIVE_TAG );
				}
			}

		}
	}

	btDiscreteDynamicsWorld::updateActivationState(timeStep);
}